

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::postCoarseTimeStep(AmrLevel *this,Real time)

{
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  bool bVar2;
  Amr *pAVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pAVar3 = this->parent;
  if (-1 < *(int *)&(pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
    lVar8 = 0;
    do {
      _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (pAVar3->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      lVar6 = *(long *)((long)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x170)
      ;
      if (*(long *)((long)_Var1.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x178) !=
          lVar6 && -1 < *(long *)((long)_Var1.
                                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                        _M_head_impl + 0x178) - lVar6) {
        lVar7 = 0;
        lVar5 = 0;
        do {
          StateData::syncNewTimeLevel((StateData *)(lVar6 + lVar7),time);
          lVar5 = lVar5 + 1;
          lVar6 = *(long *)((long)_Var1.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x170);
          lVar4 = (*(long *)((long)_Var1.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                   .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                            0x178) - lVar6 >> 5) * 0x6db6db6db6db6db7;
          lVar7 = lVar7 + 0xe0;
        } while (lVar4 - lVar5 != 0 && lVar5 <= lVar4);
      }
      pAVar3 = this->parent;
      bVar2 = lVar8 < *(int *)&(pAVar3->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      lVar8 = lVar8 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void
AmrLevel::postCoarseTimeStep (Real time)
{
    BL_ASSERT(level == 0);
    // sync up statedata time
    for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
        AmrLevel& amrlevel = parent->getLevel(lev);
        for (int i = 0; i < amrlevel.state.size(); ++i) {
            amrlevel.state[i].syncNewTimeLevel(time);
        }
    }
}